

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::emplace_helper<QPropertyAnimation*>
          (QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *this,
          pair<QObject_*,_QByteArray> *key,QPropertyAnimation **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *in_RDX;
  Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
  *in_stack_ffffffffffffff90;
  pair<QObject_*,_QByteArray> *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
  findOrInsert<std::pair<QObject*,QByteArray>>(in_RSI,&in_RDX->key);
  QHashPrivate::
  iterator<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::node
            ((iterator<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
              *)in_RDX);
  QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>::
  createInPlace<QPropertyAnimation*>
            (in_RDX,in_stack_ffffffffffffff98,(QPropertyAnimation **)in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>::iterator::iterator
            (in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }